

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O0

uint64_t Hacl_Bignum64_lt_mask(uint32_t len,uint64_t *a,uint64_t *b)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t blt;
  uint64_t beq;
  ulong uStack_28;
  uint32_t i;
  uint64_t acc;
  uint64_t *b_local;
  uint64_t *a_local;
  uint32_t len_local;
  
  uStack_28 = 0;
  for (beq._4_4_ = 0; beq._4_4_ < len; beq._4_4_ = beq._4_4_ + 1) {
    uVar1 = FStar_UInt64_eq_mask(a[beq._4_4_],b[beq._4_4_]);
    uVar2 = FStar_UInt64_gte_mask(a[beq._4_4_],b[beq._4_4_]);
    uStack_28 = uVar1 & uStack_28 | (uVar1 ^ 0xffffffffffffffff) & (uVar2 ^ 0xffffffffffffffff);
  }
  return uStack_28;
}

Assistant:

uint64_t Hacl_Bignum64_lt_mask(uint32_t len, uint64_t *a, uint64_t *b)
{
  uint64_t acc = 0ULL;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint64_t beq = FStar_UInt64_eq_mask(a[i], b[i]);
    uint64_t blt = ~FStar_UInt64_gte_mask(a[i], b[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFFFFFFFFFULL) | (~blt & 0ULL)));
  }
  return acc;
}